

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O2

jint Java_beagle_BeagleJNIWrapper_calculateEdgeDifferentials
               (JNIEnv *env,jobject obj,jint instance,jintArray postBufferIndices,
               jintArray preBufferIndices,jintArray derivativeMatrixIndices,
               jintArray categoryWeightsIndices,jint count,jdoubleArray outDerivatives,
               jdoubleArray outSumDerivatives,jdoubleArray outSumSquaredDerivatives)

{
  jint jVar1;
  jdouble *pjVar2;
  jdouble *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jint *pjVar6;
  jint *pjVar7;
  jdouble *local_60;
  
  if (outDerivatives == (jdoubleArray)0x0) {
    pjVar2 = (jdouble *)0x0;
  }
  else {
    pjVar2 = (*env->functions->GetDoubleArrayElements)(env,outDerivatives,(jboolean *)0x0);
  }
  if (outSumDerivatives == (jdoubleArray)0x0) {
    local_60 = (jdouble *)0x0;
  }
  else {
    local_60 = (*env->functions->GetDoubleArrayElements)(env,outSumDerivatives,(jboolean *)0x0);
  }
  if (outSumSquaredDerivatives == (jdoubleArray)0x0) {
    pjVar3 = (jdouble *)0x0;
  }
  else {
    pjVar3 = (*env->functions->GetDoubleArrayElements)(env,outSumSquaredDerivatives,(jboolean *)0x0)
    ;
  }
  pjVar4 = (*env->functions->GetIntArrayElements)(env,postBufferIndices,(jboolean *)0x0);
  pjVar5 = (*env->functions->GetIntArrayElements)(env,preBufferIndices,(jboolean *)0x0);
  pjVar6 = (*env->functions->GetIntArrayElements)(env,derivativeMatrixIndices,(jboolean *)0x0);
  pjVar7 = (*env->functions->GetIntArrayElements)(env,categoryWeightsIndices,(jboolean *)0x0);
  jVar1 = beagleCalculateEdgeDerivatives
                    (instance,pjVar4,pjVar5,pjVar6,pjVar7,count,pjVar2,local_60,pjVar3);
  (*env->functions->ReleaseIntArrayElements)(env,postBufferIndices,pjVar4,2);
  (*env->functions->ReleaseIntArrayElements)(env,preBufferIndices,pjVar5,2);
  (*env->functions->ReleaseIntArrayElements)(env,derivativeMatrixIndices,pjVar6,2);
  (*env->functions->ReleaseIntArrayElements)(env,categoryWeightsIndices,pjVar7,2);
  if (outDerivatives != (jdoubleArray)0x0) {
    (*env->functions->ReleaseDoubleArrayElements)(env,outDerivatives,pjVar2,0);
  }
  if (outSumDerivatives != (jdoubleArray)0x0) {
    (*env->functions->ReleaseDoubleArrayElements)(env,outSumDerivatives,local_60,0);
  }
  if (outSumSquaredDerivatives != (jdoubleArray)0x0) {
    (*env->functions->ReleaseDoubleArrayElements)(env,outSumSquaredDerivatives,pjVar3,0);
  }
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateEdgeDifferentials
        (JNIEnv *env, jobject obj, jint instance,
                jintArray postBufferIndices,
                jintArray preBufferIndices,
                jintArray derivativeMatrixIndices,
                jintArray categoryWeightsIndices,
                jint count,
                jdoubleArray outDerivatives,
                jdoubleArray outSumDerivatives,
                jdoubleArray outSumSquaredDerivatives) {

    jdouble *jOutDerivatives = outDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outDerivatives, NULL);

    jdouble* jOutSumDerivatives = outSumDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumDerivatives, NULL);

    jdouble* jOutSumSquaredDerivatives = outSumSquaredDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumSquaredDerivatives, NULL);

    jint *jPostBufferIndices = env->GetIntArrayElements(postBufferIndices, NULL);
    jint *jPreBufferIndices  = env->GetIntArrayElements(preBufferIndices, NULL);

    jint *jDerivativeMatrixIndices = env->GetIntArrayElements(derivativeMatrixIndices, NULL);
    jint *jCategoryWeightsIndices = env->GetIntArrayElements(categoryWeightsIndices, NULL);

    jint errCode = beagleCalculateEdgeDerivatives(instance, (int*)jPostBufferIndices, (int*)jPreBufferIndices,
                                                 (int*)jDerivativeMatrixIndices, (int*)jCategoryWeightsIndices, count,
                                                 jOutDerivatives, jOutSumDerivatives, jOutSumSquaredDerivatives);

    env->ReleaseIntArrayElements(postBufferIndices, jPostBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(preBufferIndices, jPreBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(derivativeMatrixIndices, jDerivativeMatrixIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(categoryWeightsIndices, jCategoryWeightsIndices, JNI_ABORT);

    if (outDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outDerivatives, jOutDerivatives, 0);
    }

    if (outSumDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumDerivatives, jOutSumDerivatives, 0);
    }

    if (outSumSquaredDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumSquaredDerivatives, jOutSumSquaredDerivatives, 0);
    }

    return errCode;
}